

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::Promise<kj::ArrayPtr<char>_>::Promise(Promise<kj::ArrayPtr<char>_> *this,Exception *exception)

{
  ImmediateBrokenPromiseNode *pIVar1;
  Own<kj::_::ImmediateBrokenPromiseNode> local_30;
  Own<kj::_::PromiseNode> local_20;
  
  heap<kj::_::ImmediateBrokenPromiseNode,kj::Exception>((kj *)&local_30,exception);
  pIVar1 = local_30.ptr;
  local_20.disposer = local_30.disposer;
  local_30.ptr = (ImmediateBrokenPromiseNode *)0x0;
  (this->super_PromiseBase).node.disposer = local_30.disposer;
  (this->super_PromiseBase).node.ptr = (PromiseNode *)pIVar1;
  local_20.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode>::dispose(&local_20);
  Own<kj::_::ImmediateBrokenPromiseNode>::dispose(&local_30);
  return;
}

Assistant:

Promise<T>::Promise(kj::Exception&& exception)
    : PromiseBase(heap<_::ImmediateBrokenPromiseNode>(kj::mv(exception))) {}